

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselection.cpp
# Opt level: O3

CAmount __thiscall
wallet::SelectionResult::GetChange
          (SelectionResult *this,CAmount min_viable_change,CAmount change_fee)

{
  long lVar1;
  CAmount CVar2;
  _Base_ptr p_Var3;
  long lVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_use_effective == true) {
    CVar2 = GetSelectedEffectiveValue(this);
    lVar4 = CVar2 - (change_fee + this->m_target);
  }
  else {
    lVar4 = 0;
    for (p_Var3 = (this->m_selected_inputs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 != &(this->m_selected_inputs)._M_t._M_impl.super__Rb_tree_header;
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var3)) {
      lVar4 = lVar4 + *(long *)(*(long *)(p_Var3 + 1) + 0x48);
    }
    lVar4 = lVar4 - this->m_target;
  }
  CVar2 = 0;
  if (min_viable_change <= lVar4) {
    CVar2 = lVar4;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return CVar2;
  }
  __stack_chk_fail();
}

Assistant:

CAmount SelectionResult::GetChange(const CAmount min_viable_change, const CAmount change_fee) const
{
    // change = SUM(inputs) - SUM(outputs) - fees
    // 1) With SFFO we don't pay any fees
    // 2) Otherwise we pay all the fees:
    //  - input fees are covered by GetSelectedEffectiveValue()
    //  - non_input_fee is included in m_target
    //  - change_fee
    const CAmount change = m_use_effective
                           ? GetSelectedEffectiveValue() - m_target - change_fee
                           : GetSelectedValue() - m_target;

    if (change < min_viable_change) {
        return 0;
    }

    return change;
}